

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::DoIt(string *subFolder,bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  string local_40 [8];
  string path;
  string *parquetOutFile_local;
  bool ordOutput_local;
  bool skipHeader_local;
  string *subFolder_local;
  
  LoadPeriodToWeighting();
  LoadOccurrence();
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"work/");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
  bVar1 = std::operator!=(local_60,"/");
  std::__cxx11::string::~string((string *)local_60);
  if (bVar1) {
    std::operator+(local_90,(char *)local_40);
    std::__cxx11::string::operator=(local_40,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
  }
  ReadFilesInDirectory((string *)local_40);
  OutputRows(skipHeader,ordOutput,parquetOutFile);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void DoIt(const std::string& subFolder, const bool skipHeader,
	    const bool ordOutput, const std::string& parquetOutFile) {

    LoadPeriodToWeighting();
    LoadOccurrence();

    std::string path = "work/" + subFolder;
    if (path.substr(path.length() - 1, 1) != "/") {
      path = path + "/";
    }
    ReadFilesInDirectory(path);
    OutputRows(skipHeader, ordOutput, parquetOutFile);

  }